

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderTextureFunctionTests.cpp
# Opt level: O3

void deqp::gles3::Functional::evalTextureCubeGrad(ShaderEvalContext *c,TexLookupParams *p)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined1 local_28 [8];
  float fStack_20;
  float fStack_1c;
  
  fVar1 = c->in[0].m_data[0];
  fVar2 = c->in[0].m_data[1];
  fVar3 = c->in[0].m_data[2];
  fVar6 = -fVar3;
  if (-fVar3 <= fVar3) {
    fVar6 = fVar3;
  }
  fVar6 = (float)(c->textures[0].texCube)->m_size / (fVar6 + fVar6);
  fVar6 = glu::TextureTestUtil::computeLodFromDerivates
                    (LODMODE_EXACT,c->in[1].m_data[0] * fVar6,c->in[1].m_data[1] * fVar6,
                     c->in[2].m_data[0] * fVar6,fVar6 * c->in[2].m_data[1]);
  tcu::TextureCubeView::sample
            ((TextureCubeView *)local_28,(Sampler *)&(c->textures[0].texCube)->m_view,fVar1,fVar2,
             fVar3,fVar6);
  fVar1 = (p->scale).m_data[1];
  fVar2 = (p->scale).m_data[2];
  fVar3 = (p->scale).m_data[3];
  fVar6 = (p->bias).m_data[1];
  fVar4 = (p->bias).m_data[2];
  fVar5 = (p->bias).m_data[3];
  (c->color).m_data[0] = (p->scale).m_data[0] * (float)local_28._0_4_ + (p->bias).m_data[0];
  (c->color).m_data[1] = fVar1 * (float)local_28._4_4_ + fVar6;
  (c->color).m_data[2] = fVar2 * fStack_20 + fVar4;
  (c->color).m_data[3] = fVar3 * fStack_1c + fVar5;
  return;
}

Assistant:

static void		evalTextureCubeGrad		(gls::ShaderEvalContext& c, const TexLookupParams& p)	{ c.color = textureCube(c, c.in[0].x(), c.in[0].y(), c.in[0].z(), computeLodFromGradCube(c))*p.scale + p.bias; }